

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

IndexPointer __thiscall
duckdb::FixedSizeAllocator::VacuumPointer(FixedSizeAllocator *this,IndexPointer ptr)

{
  idx_t iVar1;
  idx_t iVar2;
  IndexPointer IVar3;
  pointer pFVar4;
  data_ptr_t pdVar5;
  __node_base_ptr p_Var6;
  data_ptr_t pdVar7;
  __hash_code __code;
  __node_base_ptr p_Var8;
  
  IVar3 = New(this);
  this->total_segment_count = this->total_segment_count - 1;
  p_Var6 = (this->buffers)._M_h._M_buckets
           [(ulong)(IVar3.data & 0xffffffff) % (this->buffers)._M_h._M_bucket_count];
  for (p_Var8 = p_Var6->_M_nxt; (_Hash_node_base *)(IVar3.data & 0xffffffff) != p_Var8[1]._M_nxt;
      p_Var8 = p_Var8->_M_nxt) {
    p_Var6 = p_Var8;
  }
  pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)(p_Var6->_M_nxt + 2));
  pdVar5 = FixedSizeBuffer::Get(pFVar4,true);
  iVar1 = this->segment_size;
  iVar2 = this->bitmask_offset;
  p_Var6 = (this->buffers)._M_h._M_buckets
           [(ulong)(ptr.data & 0xffffffff) % (this->buffers)._M_h._M_bucket_count];
  for (p_Var8 = p_Var6->_M_nxt; (_Hash_node_base *)(ptr.data & 0xffffffff) != p_Var8[1]._M_nxt;
      p_Var8 = p_Var8->_M_nxt) {
    p_Var6 = p_Var8;
  }
  pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)(p_Var6->_M_nxt + 2));
  pdVar7 = FixedSizeBuffer::Get(pFVar4,true);
  switchD_00b1422a::default
            (pdVar5 + iVar2 + iVar1 * (IVar3.data >> 0x20 & 0xffffff),
             pdVar7 + this->bitmask_offset + (ptr.data >> 0x20 & 0xffffff) * this->segment_size,
             this->segment_size);
  return (IndexPointer)IVar3.data;
}

Assistant:

IndexPointer FixedSizeAllocator::VacuumPointer(const IndexPointer ptr) {
	// we do not need to adjust the bitmask of the old buffer, because we will free the entire
	// buffer after the vacuum operation

	auto new_ptr = New();
	// new increases the allocation count, we need to counter that here
	total_segment_count--;

	memcpy(Get(new_ptr), Get(ptr), segment_size);
	return new_ptr;
}